

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void CleanSpaces(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Bool BVar2;
  bool bVar3;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pNVar1 = node;
  while (next = pNVar1, next != (Node *)0x0) {
    pNVar1 = next->next;
    BVar2 = prvTidynodeIsText(next);
    if ((BVar2 != no) && (BVar2 = CleanLeadingWhitespace(doc,next), BVar2 != no)) {
      while( true ) {
        bVar3 = false;
        if (next->start < next->end) {
          BVar2 = prvTidyIsWhite((int)doc->lexer->lexbuf[next->start]);
          bVar3 = BVar2 != no;
        }
        if (!bVar3) break;
        next->start = next->start + 1;
      }
    }
    BVar2 = prvTidynodeIsText(next);
    if ((BVar2 != no) && (BVar2 = CleanTrailingWhitespace(doc,next), BVar2 != no)) {
      while( true ) {
        bVar3 = false;
        if (next->start < next->end) {
          BVar2 = prvTidyIsWhite((int)doc->lexer->lexbuf[next->end - 1]);
          bVar3 = BVar2 != no;
        }
        if (!bVar3) break;
        next->end = next->end - 1;
      }
    }
    BVar2 = prvTidynodeIsText(next);
    if ((BVar2 == no) || (next->start < next->end)) {
      if (next->content != (Node *)0x0) {
        CleanSpaces(doc,next->content);
      }
    }
    else {
      prvTidyRemoveNode(next);
      prvTidyFreeNode(doc,next);
    }
  }
  return;
}

Assistant:

static void CleanSpaces(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (TY_(nodeIsText)(node) && CleanLeadingWhitespace(doc, node))
            while (node->start < node->end && TY_(IsWhite)(doc->lexer->lexbuf[node->start]))
                ++(node->start);

        if (TY_(nodeIsText)(node) && CleanTrailingWhitespace(doc, node))
            while (node->end > node->start && TY_(IsWhite)(doc->lexer->lexbuf[node->end - 1]))
                --(node->end);

        if (TY_(nodeIsText)(node) && !(node->start < node->end))
        {
            TY_(RemoveNode)(node);
            TY_(FreeNode)(doc, node);
            node = next;

            continue;
        }

        if (node->content)
            CleanSpaces(doc, node->content);

        node = next;
    }
}